

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-spell.c
# Opt level: O3

_Bool spell_cast(wchar_t spell_index,wchar_t dir,command *cmd)

{
  uint32_t *puVar1;
  byte bVar2;
  short sVar3;
  effect *effect;
  wchar_t *pwVar4;
  _Bool _Var5;
  int16_t iVar6;
  wchar_t wVar7;
  uint32_t uVar8;
  int iVar9;
  wchar_t *pwVar10;
  char *dice_string;
  player *p;
  wchar_t wVar11;
  class_spell *pcVar12;
  source sVar13;
  source origin;
  source origin_00;
  _Bool ident;
  command *local_38;
  
  ident = false;
  wVar11 = (wchar_t)player->lev;
  local_38 = cmd;
  _Var5 = flag_has_dbg((player->state).pflags,10,0x44,"player->state.pflags","(PF_HEIGHTEN_MAGIC)");
  if (_Var5) {
    wVar11 = wVar11 + (player->heighten_power + 5) / 10 + L'\x01';
  }
  _Var5 = flag_has_dbg((player->state).pflags,10,0x47,"player->state.pflags","(PF_CHANNELING)");
  if (_Var5) {
    wVar7 = player_get_channeling_boost(player);
    wVar11 = wVar7 + wVar11;
  }
  _Var5 = flag_has_dbg((player->state).pflags,10,0x1b,"player->state.pflags","(PF_BEAM)");
  wVar7 = wVar11 / 2;
  if (_Var5) {
    wVar7 = wVar11;
  }
  if (spell_index < L'\0') {
    pcVar12 = (class_spell *)0x0;
  }
  else {
    pcVar12 = (class_spell *)0x0;
    if (spell_index < (player->class->magic).total_spells) {
      pwVar4 = &((player->class->magic).books)->num_spells;
      do {
        pwVar10 = pwVar4;
        iVar9 = (int)pcVar12;
        wVar11 = *pwVar10 + iVar9;
        pcVar12 = (class_spell *)(ulong)(uint)wVar11;
        pwVar4 = pwVar10 + 8;
      } while (wVar11 <= spell_index);
      pcVar12 = *(class_spell **)(pwVar10 + 3) + (spell_index - iVar9);
    }
  }
  iVar6 = spell_chance(spell_index);
  uVar8 = Rand_div(100);
  if ((int)uVar8 < (int)iVar6) {
    event_signal(EVENT_INPUT_FLUSH);
    msg("You failed to concentrate hard enough!");
    wVar11 = pcVar12->smana;
    wVar7 = (wchar_t)player->csp;
    p = player;
    if (wVar11 <= wVar7) {
      player->csp = player->csp - (short)wVar11;
      goto LAB_001be10e;
    }
  }
  else {
    effect = pcVar12->effect;
    sVar13 = source_player();
    origin.which = sVar13.which;
    origin._4_4_ = 0;
    origin.what = sVar13.what;
    _Var5 = effect_do(effect,origin,(object *)0x0,&ident,true,dir,wVar7,L'\0',local_38);
    if (!_Var5) {
      return false;
    }
    _Var5 = flag_has_dbg((player->state).pflags,10,0x23,"player->state.pflags","(PF_COMBAT_REGEN)");
    if (_Var5) {
      convert_mana_to_hp(player,pcVar12->smana << 0x10);
    }
    sound(0x95);
    bVar2 = player->spell_flags[spell_index];
    p = player;
    if ((bVar2 & 2) == 0) {
      wVar11 = pcVar12->sexp;
      player->spell_flags[spell_index] = bVar2 | 2;
      player_exp_gain(player,wVar11 * pcVar12->slevel);
      p = player;
      puVar1 = &player->upkeep->redraw;
      *puVar1 = *puVar1 | 0x200000;
    }
    wVar11 = pcVar12->smana;
    wVar7 = (wchar_t)p->csp;
    if (wVar11 <= wVar7) {
      p->csp = p->csp - (short)wVar11;
      _Var5 = flag_has_dbg((p->state).pflags,10,0x46,"player->state.pflags","(PF_HARMONY)");
      if (_Var5) {
        iVar9 = 10;
        if (pcVar12->smana < L'\x15') {
          iVar9 = pcVar12->smana / 3 + 3;
        }
        sVar3 = player->mhp;
        sVar13 = source_player();
        origin_00.which = sVar13.which;
        dice_string = format("%d",(ulong)(uint)((sVar3 * iVar9) / 100));
        origin_00._4_4_ = 0;
        origin_00.what = sVar13.what;
        effect_simple(L'\x03',origin_00,dice_string,L'\0',L'\0',L'\0',L'\0',L'\0',(_Bool *)0x0);
      }
      goto LAB_001be10e;
    }
  }
  p->csp = 0;
  p->csp_frac = 0;
  player_over_exert(p,L'\x02',L'd',(wVar11 - wVar7) * 5 + L'\x01');
  player_over_exert(player,L'\x01',L'2',L'\0');
LAB_001be10e:
  puVar1 = &player->upkeep->redraw;
  *puVar1 = *puVar1 | 0x80;
  return true;
}

Assistant:

bool spell_cast(int spell_index, int dir, struct command *cmd)
{
	int chance;
	bool ident = false;
	int beam  = beam_chance();
	bool failed = false;

	/* Get the spell */
	const struct class_spell *spell = spell_by_index(player, spell_index);

	/* Spell failure chance */
	chance = spell_chance(spell_index);

	/* Fail or succeed */
	if (randint0(100) < chance) {
		event_signal(EVENT_INPUT_FLUSH);
		msg("You failed to concentrate hard enough!");
		failed = true;
	} else {
		/* Cast the spell */
		if (!effect_do(spell->effect, source_player(), NULL, &ident, true, dir,
					   beam, 0, cmd)) {
			return false;
		}

		/* Reward COMBAT_REGEN with small HP recovery */
		if (player_has(player, PF_COMBAT_REGEN)) {
			convert_mana_to_hp(player, spell->smana << 16);
		}

		/* A spell was cast */
		sound(MSG_SPELL);

		if (!(player->spell_flags[spell_index] & PY_SPELL_WORKED)) {
			int e = spell->sexp;

			/* The spell worked */
			player->spell_flags[spell_index] |= PY_SPELL_WORKED;

			/* Gain experience */
			player_exp_gain(player, e * spell->slevel);

			/* Redraw object recall */
			player->upkeep->redraw |= (PR_OBJECT);
		}
	}

	/* Sufficient mana? */
	if (spell->smana <= player->csp) {
		/* Use some mana */
		player->csp -= spell->smana;

		/* Specialty ability Harmony */
		if (!failed && player_has(player, PF_HARMONY)) {
			/* Percentage of max hp to be regained, capped at 10% */
			int frac = MIN(10, 3 + (spell->smana / 3));

			/* Calculate fractional bonus */
			int boost = (frac * player->mhp) / 100;

			/* Apply bonus */
			effect_simple(EF_HEAL_HP, source_player(), format("%d", boost), 0,
						  0, 0, 0, 0, NULL);
		}
	} else {
		int oops = spell->smana - player->csp;

		/* No mana left */
		player->csp = 0;
		player->csp_frac = 0;

		/* Over-exert the player */
		player_over_exert(player, PY_EXERT_FAINT, 100, 5 * oops + 1);
		player_over_exert(player, PY_EXERT_CON, 50, 0);
	}

	/* Redraw mana */
	player->upkeep->redraw |= (PR_MANA);

	return true;
}